

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

StyleProp * CreateProps(TidyDocImpl *doc,StyleProp *prop,ctmbstr style)

{
  StyleProp *pSVar1;
  char cVar2;
  int iVar3;
  tmbstr ptVar4;
  StyleProp *pSVar5;
  tmbstr ptVar6;
  char *pcVar7;
  StyleProp *pSVar8;
  char *pcVar9;
  StyleProp *pSVar10;
  char *s2;
  ctmbstr str;
  ctmbstr ptVar11;
  
  ptVar4 = prvTidytmbstrdup(doc->allocator,style);
  cVar2 = *ptVar4;
  s2 = ptVar4;
  while (pSVar5 = prop, cVar2 != '\0') {
    while (cVar2 == ' ') {
      pcVar7 = s2 + 1;
      s2 = s2 + 1;
      cVar2 = *pcVar7;
    }
    pcVar7 = s2 + 2;
    ptVar11 = s2;
    while( true ) {
      if (cVar2 == '\0') goto LAB_0014f71b;
      str = ptVar11;
      if (cVar2 == ':') break;
      cVar2 = ptVar11[1];
      ptVar11 = ptVar11 + 1;
      pcVar7 = pcVar7 + 1;
    }
    do {
      pcVar9 = pcVar7;
      cVar2 = str[1];
      str = str + 1;
      pcVar7 = pcVar9 + 1;
    } while (cVar2 == ' ');
    while ((cVar2 != '\0' && (cVar2 != ';'))) {
      cVar2 = *pcVar9;
      pcVar9 = pcVar9 + 1;
    }
    *ptVar11 = '\0';
    pcVar9[-1] = '\0';
    if (prop == (StyleProp *)0x0) {
      pSVar10 = (StyleProp *)0x0;
    }
    else {
      pSVar1 = prop;
      pSVar8 = (StyleProp *)0x0;
      do {
        pSVar10 = pSVar1;
        iVar3 = prvTidytmbstrcmp(pSVar10->name,s2);
        if (iVar3 == 0) goto LAB_0014f6ed;
        if (0 < iVar3) {
          pSVar5 = (StyleProp *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x18);
          ptVar6 = prvTidytmbstrdup(doc->allocator,s2);
          pSVar5->name = ptVar6;
          ptVar6 = prvTidytmbstrdup(doc->allocator,str);
          pSVar5->value = ptVar6;
          pSVar5->next = pSVar10;
          pSVar10 = pSVar8;
          goto joined_r0x0014f6e2;
        }
        pSVar1 = pSVar10->next;
        pSVar8 = pSVar10;
      } while (pSVar10->next != (StyleProp *)0x0);
    }
    pSVar5 = (StyleProp *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x18);
    ptVar6 = prvTidytmbstrdup(doc->allocator,s2);
    pSVar5->name = ptVar6;
    ptVar6 = prvTidytmbstrdup(doc->allocator,str);
    pSVar5->value = ptVar6;
    pSVar5->next = (StyleProp *)0x0;
joined_r0x0014f6e2:
    if (pSVar10 != (StyleProp *)0x0) {
      pSVar10->next = pSVar5;
      pSVar5 = prop;
    }
LAB_0014f6ed:
    *ptVar11 = ':';
    if (cVar2 == '\0') break;
    pcVar9[-1] = ';';
    prop = pSVar5;
    s2 = pcVar9;
    cVar2 = *pcVar9;
  }
LAB_0014f71b:
  (*doc->allocator->vtbl->free)(doc->allocator,ptVar4);
  return pSVar5;
}

Assistant:

static StyleProp* CreateProps( TidyDocImpl* doc, StyleProp* prop, ctmbstr style )
{
    tmbstr name, value = NULL, name_end, value_end, line;
    Bool more;

    line = TY_(tmbstrdup)(doc->allocator, style);
    name = line;

    while (*name)
    {
        while (*name == ' ')
            ++name;

        name_end = name;

        while (*name_end)
        {
            if (*name_end == ':')
            {
                value = name_end + 1;
                break;
            }

            ++name_end;
        }

        if (*name_end != ':')
            break;

        while ( value && *value == ' ')
            ++value;

        value_end = value;
        more = no;

        while (*value_end)
        {
            if (*value_end == ';')
            {
                more = yes;
                break;
            }

            ++value_end;
        }

        *name_end = '\0';
        *value_end = '\0';

        prop = InsertProperty(doc, prop, name, value);
        *name_end = ':';

        if (more)
        {
            *value_end = ';';
            name = value_end + 1;
            continue;
        }

        break;
    }

    TidyDocFree(doc, line);  /* free temporary copy */
    return prop;
}